

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmListCommand.cxx
# Opt level: O2

bool __thiscall
anon_unknown.dwarf_5504af::cmStringSorter::operator()(cmStringSorter *this,string *a,string *b)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__args;
  bool bVar1;
  string *__args_1;
  string bf;
  string af;
  string local_60;
  string local_40;
  
  ApplyFilter(&local_40,this,a);
  ApplyFilter(&local_60,this,b);
  __args_1 = &local_60;
  __args = &local_40;
  if (this->descending != false) {
    __args_1 = &local_40;
    __args = &local_60;
  }
  bVar1 = std::
          function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
          ::operator()(&this->sortMethod,__args,__args_1);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_40);
  return bVar1;
}

Assistant:

bool operator()(const std::string& a, const std::string& b)
  {
    std::string af = this->ApplyFilter(a);
    std::string bf = this->ApplyFilter(b);
    bool result;
    if (this->descending) {
      result = this->sortMethod(bf, af);
    } else {
      result = this->sortMethod(af, bf);
    }
    return result;
  }